

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<double>_>::AddBlockNumbers
          (TPZTransfer<std::complex<double>_> *this,int row,TPZVec<int> *colnumbers)

{
  int iVar1;
  int iVar2;
  ostream *this_00;
  void *this_01;
  int *piVar3;
  int64_t iVar4;
  TPZVec<int> *in_RDX;
  int in_ESI;
  long in_RDI;
  int lastic;
  int ic;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  TPZTransfer<std::complex<double>_> *in_stack_ffffffffffffffb8;
  TPZTransfer<std::complex<double>_> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  iVar2 = HasRowDefinition(in_stack_ffffffffffffffb8,0);
  if (iVar2 != 0) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "TPZTransfer:SetBlocks called for an already defined row = ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_ESI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  iVar2 = *(int *)(in_RDI + 0x290);
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x1c0),(long)in_ESI);
  *piVar3 = iVar2;
  iVar4 = TPZVec<int>::NElements(in_RDX);
  iVar2 = (int)iVar4;
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x1e0),(long)in_ESI);
  *piVar3 = iVar2;
  TPZVec<int>::NElements(in_RDX);
  ExpandColumnVectorEntries(in_stack_ffffffffffffffd0,iVar2);
  local_1c = *(int *)(in_RDI + 0x290);
  iVar2 = local_1c;
  iVar4 = TPZVec<int>::NElements(in_RDX);
  iVar2 = iVar2 + (int)iVar4;
  for (; local_1c < iVar2; local_1c = local_1c + 1) {
    piVar3 = TPZVec<int>::operator[](in_RDX,(long)(local_1c - *(int *)(in_RDI + 0x290)));
    iVar1 = *piVar3;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x248),(long)local_1c);
    *piVar3 = iVar1;
  }
  *(int *)(in_RDI + 0x290) = iVar2;
  return;
}

Assistant:

void TPZTransfer<TVar>::AddBlockNumbers(int row, TPZVec<int> &colnumbers){
	if(HasRowDefinition(row)) {
		cout << "TPZTransfer:SetBlocks called for an already defined row = " <<
		row << endl;
		DebugStop();
	}
	fColPosition[row] = fColumnBlockLastUsed;
	fNumberofColumnBlocks[row] = colnumbers.NElements();
	// will specify the sparsity pattern of row
	ExpandColumnVectorEntries(colnumbers.NElements());
	int ic= fColumnBlockLastUsed, lastic = ic+colnumbers.NElements();
	for(;ic < lastic; ic++) {
		fColumnBlockNumber[ic] = colnumbers[ic-fColumnBlockLastUsed];
	}
	fColumnBlockLastUsed = lastic;
}